

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed.c
# Opt level: O0

int read_feed(feed_t *instance,char *feed_directory_path)

{
  int iVar1;
  FILE *pFVar2;
  FILE *fp_trips;
  FILE *fp_transfers;
  FILE *fp_stops;
  FILE *fp_stop_times;
  FILE *fp_shapes;
  FILE *fp_routes;
  FILE *fp_pathways;
  FILE *fp_levels;
  FILE *fp_frequencies;
  FILE *fp_feed_info;
  FILE *fp_fare_rules;
  FILE *fp_fare_attributes;
  FILE *fp_calendar_records;
  FILE *fp_calendar_dates;
  FILE *fp_agencies;
  char *trips_fname;
  char *transfers_fname;
  char *stops_fname;
  char *stop_times_fname;
  char *shapes_fname;
  char *routes_fname;
  char *pathways_fname;
  char *levels_fname;
  char *frequencies_fname;
  char *feed_info_fname;
  char *fare_rules_fname;
  char *fare_attributes_fname;
  char *calendar_records_fname;
  char *calendar_dates_fname;
  char *agencies_fname;
  char *feed_directory_path_local;
  feed_t *instance_local;
  
  agencies_fname = feed_directory_path;
  feed_directory_path_local = (char *)instance;
  make_filepath(&calendar_dates_fname,feed_directory_path,"agency.txt");
  make_filepath(&calendar_records_fname,agencies_fname,"calendar_dates.txt");
  make_filepath(&fare_attributes_fname,agencies_fname,"calendar.txt");
  make_filepath(&fare_rules_fname,agencies_fname,"fare_attributes.txt");
  make_filepath(&feed_info_fname,agencies_fname,"fare_rules.txt");
  make_filepath(&frequencies_fname,agencies_fname,"feed_info.txt");
  make_filepath(&levels_fname,agencies_fname,"frequencies.txt");
  make_filepath(&pathways_fname,agencies_fname,"levels.txt");
  make_filepath(&routes_fname,agencies_fname,"pathways.txt");
  make_filepath(&shapes_fname,agencies_fname,"routes.txt");
  make_filepath(&stop_times_fname,agencies_fname,"shapes.txt");
  make_filepath(&stops_fname,agencies_fname,"stop_times.txt");
  make_filepath(&transfers_fname,agencies_fname,"stops.txt");
  make_filepath(&trips_fname,agencies_fname,"transfers.txt");
  make_filepath((char **)&fp_agencies,agencies_fname,"trips.txt");
  init_feed((feed_t *)feed_directory_path_local);
  pFVar2 = fopen(calendar_dates_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[8] = -1;
    feed_directory_path_local[9] = -1;
    feed_directory_path_local[10] = -1;
    feed_directory_path_local[0xb] = -1;
  }
  else {
    iVar1 = read_all_agencies((FILE *)pFVar2,(agency_t **)feed_directory_path_local);
    *(int *)(feed_directory_path_local + 8) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(calendar_records_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x18] = -1;
    feed_directory_path_local[0x19] = -1;
    feed_directory_path_local[0x1a] = -1;
    feed_directory_path_local[0x1b] = -1;
  }
  else {
    iVar1 = read_all_calendar_dates
                      ((FILE *)pFVar2,(calendar_date_t **)(feed_directory_path_local + 0x10));
    *(int *)(feed_directory_path_local + 0x18) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(fare_attributes_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x28] = -1;
    feed_directory_path_local[0x29] = -1;
    feed_directory_path_local[0x2a] = -1;
    feed_directory_path_local[0x2b] = -1;
  }
  else {
    iVar1 = read_all_calendar_records
                      ((FILE *)pFVar2,(calendar_record_t **)(feed_directory_path_local + 0x20));
    *(int *)(feed_directory_path_local + 0x28) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(fare_rules_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x38] = -1;
    feed_directory_path_local[0x39] = -1;
    feed_directory_path_local[0x3a] = -1;
    feed_directory_path_local[0x3b] = -1;
  }
  else {
    iVar1 = read_all_fare_attributes
                      ((FILE *)pFVar2,(fare_attributes_t **)(feed_directory_path_local + 0x30));
    *(int *)(feed_directory_path_local + 0x38) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(feed_info_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x48] = -1;
    feed_directory_path_local[0x49] = -1;
    feed_directory_path_local[0x4a] = -1;
    feed_directory_path_local[0x4b] = -1;
  }
  else {
    iVar1 = read_all_fare_rules((FILE *)pFVar2,(fare_rule_t **)(feed_directory_path_local + 0x40));
    *(int *)(feed_directory_path_local + 0x48) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(frequencies_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x58] = -1;
    feed_directory_path_local[0x59] = -1;
    feed_directory_path_local[0x5a] = -1;
    feed_directory_path_local[0x5b] = -1;
  }
  else {
    iVar1 = read_all_feed_info((FILE *)pFVar2,(feed_info_t **)(feed_directory_path_local + 0x50));
    *(int *)(feed_directory_path_local + 0x58) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(levels_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x68] = -1;
    feed_directory_path_local[0x69] = -1;
    feed_directory_path_local[0x6a] = -1;
    feed_directory_path_local[0x6b] = -1;
  }
  else {
    iVar1 = read_all_frequencies((FILE *)pFVar2,(frequency_t **)(feed_directory_path_local + 0x60));
    *(int *)(feed_directory_path_local + 0x68) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(pathways_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x78] = -1;
    feed_directory_path_local[0x79] = -1;
    feed_directory_path_local[0x7a] = -1;
    feed_directory_path_local[0x7b] = -1;
  }
  else {
    iVar1 = read_all_levels((FILE *)pFVar2,(level_t **)(feed_directory_path_local + 0x70));
    *(int *)(feed_directory_path_local + 0x78) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(routes_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x88] = -1;
    feed_directory_path_local[0x89] = -1;
    feed_directory_path_local[0x8a] = -1;
    feed_directory_path_local[0x8b] = -1;
  }
  else {
    iVar1 = read_all_pathways((FILE *)pFVar2,(pathway_t **)(feed_directory_path_local + 0x80));
    *(int *)(feed_directory_path_local + 0x88) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(shapes_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0x98] = -1;
    feed_directory_path_local[0x99] = -1;
    feed_directory_path_local[0x9a] = -1;
    feed_directory_path_local[0x9b] = -1;
  }
  else {
    iVar1 = read_all_routes((FILE *)pFVar2,(route_t **)(feed_directory_path_local + 0x90));
    *(int *)(feed_directory_path_local + 0x98) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(stop_times_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0xa8] = -1;
    feed_directory_path_local[0xa9] = -1;
    feed_directory_path_local[0xaa] = -1;
    feed_directory_path_local[0xab] = -1;
  }
  else {
    iVar1 = read_all_shapes((FILE *)pFVar2,(shape_t **)(feed_directory_path_local + 0xa0));
    *(int *)(feed_directory_path_local + 0xa8) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(stops_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0xb8] = -1;
    feed_directory_path_local[0xb9] = -1;
    feed_directory_path_local[0xba] = -1;
    feed_directory_path_local[0xbb] = -1;
  }
  else {
    iVar1 = read_all_stop_times((FILE *)pFVar2,(stop_time_t **)(feed_directory_path_local + 0xb0));
    *(int *)(feed_directory_path_local + 0xb8) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(transfers_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[200] = -1;
    feed_directory_path_local[0xc9] = -1;
    feed_directory_path_local[0xca] = -1;
    feed_directory_path_local[0xcb] = -1;
  }
  else {
    iVar1 = read_all_stops((FILE *)pFVar2,(stop_t **)(feed_directory_path_local + 0xc0));
    *(int *)(feed_directory_path_local + 200) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen(trips_fname,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0xd8] = -1;
    feed_directory_path_local[0xd9] = -1;
    feed_directory_path_local[0xda] = -1;
    feed_directory_path_local[0xdb] = -1;
  }
  else {
    iVar1 = read_all_transfers((FILE *)pFVar2,(transfer_t **)(feed_directory_path_local + 0xd0));
    *(int *)(feed_directory_path_local + 0xd8) = iVar1;
    fclose(pFVar2);
  }
  pFVar2 = fopen((char *)fp_agencies,"r");
  if (pFVar2 == (FILE *)0x0) {
    feed_directory_path_local[0xe8] = -1;
    feed_directory_path_local[0xe9] = -1;
    feed_directory_path_local[0xea] = -1;
    feed_directory_path_local[0xeb] = -1;
  }
  else {
    iVar1 = read_all_trips((FILE *)pFVar2,(trip_t **)(feed_directory_path_local + 0xe0));
    *(int *)(feed_directory_path_local + 0xe8) = iVar1;
    fclose(pFVar2);
  }
  free(calendar_dates_fname);
  free(calendar_records_fname);
  free(fare_attributes_fname);
  free(fare_rules_fname);
  free(feed_info_fname);
  free(frequencies_fname);
  free(levels_fname);
  free(pathways_fname);
  free(routes_fname);
  free(shapes_fname);
  free(stop_times_fname);
  free(stops_fname);
  free(transfers_fname);
  free(trips_fname);
  free(fp_agencies);
  return 0;
}

Assistant:

int read_feed(feed_t *instance, const char *feed_directory_path) {
    char *agencies_fname;
    char *calendar_dates_fname;
    char *calendar_records_fname;
    char *fare_attributes_fname;
    char *fare_rules_fname;
    char *feed_info_fname;
    char *frequencies_fname;
    char *levels_fname;
    char *pathways_fname;
    char *routes_fname;
    char *shapes_fname;
    char *stop_times_fname;
    char *stops_fname;
    char *transfers_fname;
    char *trips_fname;

    make_filepath(&agencies_fname, feed_directory_path, "agency.txt");
    make_filepath(&calendar_dates_fname, feed_directory_path, "calendar_dates.txt");
    make_filepath(&calendar_records_fname, feed_directory_path, "calendar.txt");
    make_filepath(&fare_attributes_fname, feed_directory_path, "fare_attributes.txt");
    make_filepath(&fare_rules_fname, feed_directory_path, "fare_rules.txt");
    make_filepath(&feed_info_fname, feed_directory_path, "feed_info.txt");
    make_filepath(&frequencies_fname, feed_directory_path, "frequencies.txt");
    make_filepath(&levels_fname, feed_directory_path, "levels.txt");
    make_filepath(&pathways_fname, feed_directory_path, "pathways.txt");
    make_filepath(&routes_fname, feed_directory_path, "routes.txt");
    make_filepath(&shapes_fname, feed_directory_path, "shapes.txt");
    make_filepath(&stop_times_fname, feed_directory_path, "stop_times.txt");
    make_filepath(&stops_fname, feed_directory_path, "stops.txt");
    make_filepath(&transfers_fname, feed_directory_path, "transfers.txt");
    make_filepath(&trips_fname, feed_directory_path, "trips.txt");

    init_feed(instance);

    FILE *fp_agencies = fopen(agencies_fname, "r");
    if (fp_agencies) {
        instance->agency_count = read_all_agencies(fp_agencies, &(instance->agencies));
        fclose(fp_agencies);
    } else {
        instance->agency_count = -1;
    }

    FILE *fp_calendar_dates = fopen(calendar_dates_fname, "r");
    if (fp_calendar_dates) {
        instance->calendar_dates_count = read_all_calendar_dates(fp_calendar_dates, &(instance->calendar_dates));
        fclose(fp_calendar_dates);
    } else {
        instance->calendar_dates_count = -1;
    }

    FILE *fp_calendar_records = fopen(calendar_records_fname, "r");
    if (fp_calendar_records) {
        instance->calendar_records_count = read_all_calendar_records(fp_calendar_records, &(instance->calendar_records));
        fclose(fp_calendar_records);
    } else {
        instance->calendar_records_count = -1;
    }

    FILE *fp_fare_attributes = fopen(fare_attributes_fname, "r");
    if (fp_fare_attributes) {
        instance->fare_attributes_count = read_all_fare_attributes(fp_fare_attributes, &(instance->fare_attributes));
        fclose(fp_fare_attributes);
    } else {
        instance->fare_attributes_count = -1;
    }

    FILE *fp_fare_rules = fopen(fare_rules_fname, "r");
    if (fp_fare_rules) {
        instance->fare_rules_count = read_all_fare_rules(fp_fare_rules, &(instance->fare_rules));
        fclose(fp_fare_rules);
    } else {
        instance->fare_rules_count = -1;
    }

    FILE *fp_feed_info = fopen(feed_info_fname, "r");
    if (fp_feed_info) {
        instance->feed_info_count = read_all_feed_info(fp_feed_info, &(instance->feed_info));
        fclose(fp_feed_info);
    } else {
        instance->feed_info_count = -1;
    }

    FILE *fp_frequencies = fopen(frequencies_fname, "r");
    if (fp_frequencies) {
        instance->frequencies_count = read_all_frequencies(fp_frequencies, &(instance->frequencies));
        fclose(fp_frequencies);
    } else {
        instance->frequencies_count = -1;
    }

    FILE *fp_levels = fopen(levels_fname, "r");
    if (fp_levels) {
        instance->levels_count = read_all_levels(fp_levels, &(instance->levels));
        fclose(fp_levels);
    } else {
        instance->levels_count = -1;
    }

    FILE *fp_pathways = fopen(pathways_fname, "r");
    if (fp_pathways) {
        instance->pathways_count = read_all_pathways(fp_pathways, &(instance->pathways));
        fclose(fp_pathways);
    } else {
        instance->pathways_count = -1;
    }

    FILE *fp_routes = fopen(routes_fname, "r");
    if (fp_routes) {
        instance->routes_count = read_all_routes(fp_routes, &(instance->routes));
        fclose(fp_routes);
    } else {
        instance->routes_count = -1;
    }

    FILE *fp_shapes = fopen(shapes_fname, "r");
    if (fp_shapes) {
        instance->shapes_count = read_all_shapes(fp_shapes, &(instance->shapes));
        fclose(fp_shapes);
    } else {
        instance->shapes_count = -1;
    }

    FILE *fp_stop_times = fopen(stop_times_fname, "r");
    if (fp_stop_times) {
        instance->stop_times_count = read_all_stop_times(fp_stop_times, &(instance->stop_times));
        fclose(fp_stop_times);
    } else {
        instance->stop_times_count = -1;
    }

    FILE *fp_stops = fopen(stops_fname, "r");
    if (fp_stops) {
        instance->stops_count = read_all_stops(fp_stops, &(instance->stops));
        fclose(fp_stops);
    } else {
        instance->stops_count = -1;
    }

    FILE *fp_transfers = fopen(transfers_fname, "r");
    if (fp_transfers) {
        instance->transfers_count = read_all_transfers(fp_transfers, &(instance->transfers));
        fclose(fp_transfers);
    } else {
        instance->transfers_count = -1;
    }

    FILE *fp_trips = fopen(trips_fname, "r");
    if (fp_trips) {
        instance->trips_count = read_all_trips(fp_trips, &(instance->trips));
        fclose(fp_trips);
    } else {
        instance->trips_count = -1;
    }


    free(agencies_fname);
    free(calendar_dates_fname);
    free(calendar_records_fname);
    free(fare_attributes_fname);
    free(fare_rules_fname);
    free(feed_info_fname);
    free(frequencies_fname);
    free(levels_fname);
    free(pathways_fname);
    free(routes_fname);
    free(shapes_fname);
    free(stop_times_fname);
    free(stops_fname);
    free(transfers_fname);
    free(trips_fname);

    return 0;
}